

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_kotlin_generator.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::java::KotlinGenerator::Generate
          (KotlinGenerator *this,FileDescriptor *file,string *parameter,GeneratorContext *context,
          string *error)

{
  pointer pcVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  pointer pbVar4;
  pointer ppVar5;
  int iVar6;
  ZeroCopyOutputStream *output;
  ZeroCopyOutputStream *pZVar7;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  AnnotationCollector *annotation_collector_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *all_file;
  pointer pbVar8;
  pointer __rhs;
  string *psVar9;
  bool bVar10;
  unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
  file_generator;
  string kotlin_filename;
  Options file_options;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  all_annotations;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  all_files;
  string info_full_path;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  options;
  string package_dir;
  GeneratedCodeInfo annotations;
  Printer printer;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> annotation_collector;
  Printer srclist_printer;
  FileGenerator *local_2f0;
  value_type local_2d0;
  undefined1 local_2b0 [8];
  _Alloc_hider local_2a8;
  size_type local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  _Alloc_hider local_288;
  size_type local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_248;
  value_type local_228;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_208;
  string local_1f0;
  string local_1d0;
  GeneratedCodeInfo local_1b0;
  Printer local_180;
  AnnotationCollector local_e0;
  GeneratedCodeInfo *local_d8;
  Printer local_d0;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  local_208.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ParseGeneratorParameter(parameter,&local_208);
  ppVar5 = local_208.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_2a8._M_p = (pointer)&local_298;
  local_2b0[4] = false;
  local_2b0[0] = false;
  local_2b0[1] = false;
  local_2b0[2] = false;
  local_2b0[3] = false;
  local_2a0 = 0;
  local_298._M_local_buf[0] = '\0';
  local_288._M_p = (pointer)&local_278;
  local_280 = 0;
  local_278._M_local_buf[0] = '\0';
  uVar2 = local_2b0._0_4_;
  __rhs = local_208.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  do {
    local_2b0._0_4_ = uVar2;
    if (__rhs == ppVar5) {
      local_2b0[0] = (undefined1)uVar2;
      bVar10 = (bool)local_2b0[0] == false;
      if ((bVar10) && (local_2b0[2] = SUB41(uVar2,2), bVar10 = (bool)local_2b0[2] == false, bVar10))
      {
        local_2b0._1_3_ = SUB43(uVar2,1);
        local_2b0[0] = true;
        uVar3 = local_2b0._0_4_;
        local_2b0[3] = SUB41(uVar2,3);
        local_2b0._0_2_ = (undefined2)uVar3;
        local_2b0[2] = true;
      }
      local_248.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_248.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_248.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_268.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_268.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_268.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_2f0 = (FileGenerator *)0x0;
      if ((bool)local_2b0[0] == true) {
        local_2f0 = (FileGenerator *)operator_new(0xe0);
        FileGenerator::FileGenerator(local_2f0,file,(Options *)local_2b0,true);
      }
      bVar10 = FileGenerator::Validate(local_2f0,error);
      if (bVar10) {
        pcVar1 = (local_2f0->java_package_)._M_dataplus._M_p;
        local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1d0,pcVar1,pcVar1 + (local_2f0->java_package_)._M_string_length)
        ;
        JavaPackageToDir(&local_1f0,&local_1d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p);
        }
        local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2d0,local_1f0._M_dataplus._M_p,
                   local_1f0._M_dataplus._M_p + local_1f0._M_string_length);
        FileGenerator::GetKotlinClassname_abi_cxx11_((string *)&local_180,local_2f0);
        std::__cxx11::string::_M_append((char *)&local_2d0,local_180._0_8_);
        if (local_180._0_8_ != (long)&local_180 + 0x10U) {
          operator_delete((void *)local_180._0_8_);
        }
        std::__cxx11::string::append((char *)&local_2d0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_248,&local_2d0);
        local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_228,local_2d0._M_dataplus._M_p,
                   local_2d0._M_dataplus._M_p + local_2d0._M_string_length);
        std::__cxx11::string::append((char *)&local_228);
        if ((bool)local_2b0[4] == true) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_268,&local_228);
        }
        iVar6 = (*context->_vptr_GeneratorContext[2])();
        output = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar6);
        GeneratedCodeInfo::GeneratedCodeInfo(&local_1b0,(Arena *)0x0,false);
        local_e0._vptr_AnnotationCollector = (_func_int **)&PTR_AddAnnotation_004dc430;
        annotation_collector_00 = (AnnotationCollector *)0x0;
        if ((bool)local_2b0[4] != false) {
          annotation_collector_00 = &local_e0;
        }
        local_d8 = &local_1b0;
        io::Printer::Printer(&local_180,output,'$',annotation_collector_00);
        FileGenerator::GenerateKotlinSiblings(local_2f0,&local_1f0,context,&local_248,&local_268);
        if ((bool)local_2b0[4] == true) {
          iVar6 = (*context->_vptr_GeneratorContext[2])(context,&local_228);
          pZVar7 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_00,iVar6);
          MessageLite::SerializeToZeroCopyStream((MessageLite *)&local_1b0,pZVar7);
          if (pZVar7 != (ZeroCopyOutputStream *)0x0) {
            (*pZVar7->_vptr_ZeroCopyOutputStream[1])(pZVar7);
          }
        }
        if (local_280 != 0) {
          iVar6 = (*context->_vptr_GeneratorContext[2])(context,&local_288);
          pZVar7 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_01,iVar6);
          io::Printer::Printer(&local_d0,pZVar7,'$');
          pbVar4 = local_248.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (local_248.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_248.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            pbVar8 = local_248.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            do {
              io::Printer::Print<char[9],std::__cxx11::string>
                        (&local_d0,"$filename$\n",(char (*) [9])"filename",pbVar8);
              pbVar8 = pbVar8 + 1;
            } while (pbVar8 != pbVar4);
          }
          io::Printer::~Printer(&local_d0);
          if (pZVar7 != (ZeroCopyOutputStream *)0x0) {
            (*pZVar7->_vptr_ZeroCopyOutputStream[1])(pZVar7);
          }
        }
        if (local_2a0 != 0) {
          iVar6 = (*context->_vptr_GeneratorContext[2])(context,&local_2a8);
          pZVar7 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_02,iVar6);
          io::Printer::Printer(&local_d0,pZVar7,'$');
          pbVar4 = local_268.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (local_268.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_268.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            pbVar8 = local_268.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            do {
              io::Printer::Print<char[9],std::__cxx11::string>
                        (&local_d0,"$filename$\n",(char (*) [9])"filename",pbVar8);
              pbVar8 = pbVar8 + 1;
            } while (pbVar8 != pbVar4);
          }
          io::Printer::~Printer(&local_d0);
          if (pZVar7 != (ZeroCopyOutputStream *)0x0) {
            (*pZVar7->_vptr_ZeroCopyOutputStream[1])(pZVar7);
          }
        }
        io::Printer::~Printer(&local_180);
        GeneratedCodeInfo::~GeneratedCodeInfo(&local_1b0);
        if (output != (ZeroCopyOutputStream *)0x0) {
          (*output->_vptr_ZeroCopyOutputStream[1])();
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
          operator_delete(local_2d0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p);
        }
      }
      if (local_2f0 != (FileGenerator *)0x0) {
        FileGenerator::~FileGenerator(local_2f0);
        operator_delete(local_2f0);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_268);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_248);
LAB_00251542:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_p != &local_278) {
        operator_delete(local_288._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_p != &local_298) {
        operator_delete(local_2a8._M_p);
      }
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&local_208);
      return bVar10;
    }
    iVar6 = std::__cxx11::string::compare((char *)__rhs);
    psVar9 = (string *)&local_288;
    if (iVar6 == 0) {
LAB_002510a1:
      std::__cxx11::string::_M_assign(psVar9);
    }
    else {
      iVar6 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar6 == 0) {
        local_2b0[0] = true;
      }
      else {
        iVar6 = std::__cxx11::string::compare((char *)__rhs);
        if (iVar6 == 0) {
          bVar10 = false;
          std::__cxx11::string::_M_replace((ulong)error,0,(char *)error->_M_string_length,0x3ea0db);
          goto LAB_00251542;
        }
        iVar6 = std::__cxx11::string::compare((char *)__rhs);
        if (iVar6 == 0) {
          local_2b0[2] = true;
        }
        else {
          iVar6 = std::__cxx11::string::compare((char *)__rhs);
          if (iVar6 == 0) {
            local_2b0[3] = true;
          }
          else {
            iVar6 = std::__cxx11::string::compare((char *)__rhs);
            if (iVar6 != 0) {
              iVar6 = std::__cxx11::string::compare((char *)__rhs);
              psVar9 = (string *)&local_2a8;
              if (iVar6 == 0) goto LAB_002510a1;
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_180,"Unknown generator option: ",&__rhs->first);
              std::__cxx11::string::operator=((string *)error,(string *)&local_180);
              if (local_180._0_8_ != (long)&local_180 + 0x10U) {
                operator_delete((void *)local_180._0_8_);
              }
              bVar10 = false;
              goto LAB_00251542;
            }
            local_2b0[4] = true;
          }
        }
      }
    }
    __rhs = __rhs + 1;
    uVar2 = local_2b0._0_4_;
  } while( true );
}

Assistant:

bool KotlinGenerator::Generate(const FileDescriptor* file,
                               const std::string& parameter,
                               GeneratorContext* context,
                               std::string* error) const {
  // -----------------------------------------------------------------
  // parse generator options

  std::vector<std::pair<std::string, std::string> > options;
  ParseGeneratorParameter(parameter, &options);
  Options file_options;

  for (auto& option : options) {
    if (option.first == "output_list_file") {
      file_options.output_list_file = option.second;
    } else if (option.first == "immutable") {
      file_options.generate_immutable_code = true;
    } else if (option.first == "mutable") {
      *error = "Mutable not supported by Kotlin generator";
      return false;
    } else if (option.first == "shared") {
      file_options.generate_shared_code = true;
    } else if (option.first == "lite") {
      file_options.enforce_lite = true;
    } else if (option.first == "annotate_code") {
      file_options.annotate_code = true;
    } else if (option.first == "annotation_list_file") {
      file_options.annotation_list_file = option.second;
    } else {
      *error = "Unknown generator option: " + option.first;
      return false;
    }
  }

  // By default we generate immutable code and shared code for immutable API.
  if (!file_options.generate_immutable_code &&
      !file_options.generate_shared_code) {
    file_options.generate_immutable_code = true;
    file_options.generate_shared_code = true;
  }

  std::vector<std::string> all_files;
  std::vector<std::string> all_annotations;

  std::unique_ptr<FileGenerator> file_generator;
  if (file_options.generate_immutable_code) {
    file_generator.reset(
        new FileGenerator(file, file_options, /* immutable_api = */ true));
  }

  if (!file_generator->Validate(error)) {
    return false;
  }

  auto open_file = [context](const std::string& filename) {
    return std::unique_ptr<io::ZeroCopyOutputStream>(context->Open(filename));
  };
  std::string package_dir = JavaPackageToDir(file_generator->java_package());
  std::string kotlin_filename = package_dir;
  kotlin_filename += file_generator->GetKotlinClassname();
  kotlin_filename += ".kt";
  all_files.push_back(kotlin_filename);
  std::string info_full_path = kotlin_filename + ".pb.meta";
  if (file_options.annotate_code) {
    all_annotations.push_back(info_full_path);
  }

  // Generate main kotlin file.
  auto output = open_file(kotlin_filename);
  GeneratedCodeInfo annotations;
  io::AnnotationProtoCollector<GeneratedCodeInfo> annotation_collector(
      &annotations);
  io::Printer printer(
      output.get(), '$',
      file_options.annotate_code ? &annotation_collector : nullptr);

  file_generator->GenerateKotlinSiblings(package_dir, context, &all_files,
                                         &all_annotations);

  if (file_options.annotate_code) {
    auto info_output = open_file(info_full_path);
    annotations.SerializeToZeroCopyStream(info_output.get());
  }

  // Generate output list if requested.
  if (!file_options.output_list_file.empty()) {
    // Generate output list.  This is just a simple text file placed in a
    // deterministic location which lists the .kt files being generated.
    auto srclist_raw_output = open_file(file_options.output_list_file);
    io::Printer srclist_printer(srclist_raw_output.get(), '$');
    for (auto& all_file : all_files) {
      srclist_printer.Print("$filename$\n", "filename", all_file);
    }
  }

  if (!file_options.annotation_list_file.empty()) {
    // Generate output list.  This is just a simple text file placed in a
    // deterministic location which lists the .kt files being generated.
    auto annotation_list_raw_output =
        open_file(file_options.annotation_list_file);
    io::Printer annotation_list_printer(annotation_list_raw_output.get(), '$');
    for (auto& all_annotation : all_annotations) {
      annotation_list_printer.Print("$filename$\n", "filename", all_annotation);
    }
  }

  return true;
}